

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void NULLC::ResetMemory(void)

{
  long lVar1;
  
  ClearMemory();
  bigBlocks._0_8_ = 0;
  bigBlocks._16_4_ = 0x400;
  while (bigBlocks._8_8_ != 0) {
    lVar1 = *(long *)(bigBlocks._8_8_ + 0xa000);
    (*(code *)dealloc)();
    bigBlocks._8_8_ = lVar1;
  }
  bigBlocks._24_8_ = 0;
  if (blocksToFinalize != 0) {
    (*(code *)dealloc)();
  }
  blocksToFinalize = 0;
  _DAT_0022d228 = 0;
  if (blocksToFree != 0) {
    (*(code *)dealloc)();
  }
  blocksToFree = 0;
  _DAT_0022d238 = 0;
  if (finalizeList != 0) {
    (*(code *)dealloc)();
  }
  finalizeList = 0;
  _DAT_0022cbf0 = 0;
  GC::ResetGC();
  return;
}

Assistant:

void NULLC::ResetMemory()
{
	ClearMemory();

	bigBlocks.reset();

	blocksToFinalize.reset();
	blocksToFree.reset();

	finalizeList.reset();

	GC::ResetGC();
}